

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O1

void __thiscall
skiwi::anon_unknown_23::primitive_of_2_args_inlined::test(primitive_of_2_args_inlined *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int in_R8D;
  int iVar2;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  compile_fixture::build_string_to_symbol(&this->super_compile_fixture);
  (this->super_compile_fixture).field_0x20 = 1;
  paVar1 = &local_8d0.field_2;
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(+ 3 2)","");
  compile_fixture::run(&local_30,&this->super_compile_fixture,&local_8d0,true,in_R8D);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("5",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xae9,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(+ 3.2 2)","");
  compile_fixture::run(&local_50,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("5.2",&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaea,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(+ 3.2 2.3)","");
  compile_fixture::run(&local_70,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("5.5",&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaeb,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(+ 3 2.1)","");
  compile_fixture::run(&local_90,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("5.1",&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaec,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(- 3 2)","");
  compile_fixture::run(&local_b0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaee,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(- 3.2 2)","");
  compile_fixture::run(&local_d0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("1.2",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaef,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(- 3.2 2.3)","");
  compile_fixture::run(&local_f0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("0.9",&local_f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf0,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(- 3 2.1)","");
  compile_fixture::run(&local_110,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("0.9",&local_110,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf1,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(* 3 2)","");
  compile_fixture::run(&local_130,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("6",&local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf3,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(* 3.2 2)","");
  compile_fixture::run(&local_150,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("6.4",&local_150,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf4,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(* 3.0 2.3)","");
  compile_fixture::run(&local_170,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("6.9",&local_170,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf5,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(* 3 2.1)","");
  compile_fixture::run(&local_190,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("6.3",&local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf6,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(/ 8 2)","");
  compile_fixture::run(&local_1b0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("4",&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf8,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(/ 3.2 2)","");
  compile_fixture::run(&local_1d0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("1.6",&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaf9,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(/ 3.0 2.0)","");
  compile_fixture::run(&local_1f0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("1.5",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xafa,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(/ 3 2.0)","");
  compile_fixture::run(&local_210,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("1.5",&local_210,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xafb,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(< 3 2.1)","");
  compile_fixture::run(&local_230,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_230,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xafd,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(< 3.1 8)","");
  compile_fixture::run(&local_250,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_250,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xafe,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(< 3.2 2.1)","");
  compile_fixture::run(&local_270,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_270,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xaff,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(< 1 21)","");
  compile_fixture::run(&local_290,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_290,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb00,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(<= 3 2.1)","");
  compile_fixture::run(&local_2b0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_2b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb02,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(<= 3.1 8)","");
  compile_fixture::run(&local_2d0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_2d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb03,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(<= 3.2 2.1)","");
  compile_fixture::run(&local_2f0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_2f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb04,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(<= 1 21)","");
  compile_fixture::run(&local_310,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb05,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(<= 2 2.0)","");
  compile_fixture::run(&local_330,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_330,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb06,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(<= 3.0 3)","");
  compile_fixture::run(&local_350,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_350,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb07,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(<= 3.2 3.2)","");
  compile_fixture::run(&local_370,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_370,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb08,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(<= 1 1)","");
  compile_fixture::run(&local_390,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_390,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb09,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(> 3 2.1)","");
  compile_fixture::run(&local_3b0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_3b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb0b,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(> 3.1 8)","");
  compile_fixture::run(&local_3d0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_3d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb0c,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(> 3.2 2.1)","");
  compile_fixture::run(&local_3f0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_3f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb0d,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(> 1 21)","");
  compile_fixture::run(&local_410,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_410,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb0e,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(>= 3 2.1)","");
  compile_fixture::run(&local_430,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_430,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb10,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(>= 3.1 8)","");
  compile_fixture::run(&local_450,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_450,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb11,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(>= 3.2 2.1)","");
  compile_fixture::run(&local_470,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_470,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb12,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(>= 1 21)","");
  compile_fixture::run(&local_490,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_490,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb13,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(>= 2 2.0)","");
  compile_fixture::run(&local_4b0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_4b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb14,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(>= 3.0 3)","");
  compile_fixture::run(&local_4d0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_4d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb15,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(>= 3.2 3.2)","");
  compile_fixture::run(&local_4f0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_4f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb16,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(>= 1 1)","");
  compile_fixture::run(&local_510,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_510,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb17,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(= 12 13)","");
  compile_fixture::run(&local_530,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_530,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb19,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(= 12 12)","");
  compile_fixture::run(&local_550,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_550,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1a,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(= 12.1 13.1)","");
  compile_fixture::run(&local_570,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_570,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1b,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(= 12.1 12.1)","");
  compile_fixture::run(&local_590,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_590,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1c,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(= 12 13.1)","");
  compile_fixture::run(&local_5b0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_5b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1d,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(= 12 12.0)","");
  compile_fixture::run(&local_5d0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_5d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1e,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(= 12.0 13)","");
  compile_fixture::run(&local_5f0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_5f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb1f,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(= 12.0 12)","");
  compile_fixture::run(&local_610,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_610,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb20,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(!= 12 13)","");
  compile_fixture::run(&local_630,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_630,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb22,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(!= 12 12)","");
  compile_fixture::run(&local_650,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_650,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb23,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(!= 12.1 13.1)","");
  compile_fixture::run(&local_670,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_670,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb24,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(!= 12.1 12.1)","");
  compile_fixture::run(&local_690,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_690,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb25,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(!= 12 13.1)","");
  compile_fixture::run(&local_6b0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_6b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb26,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(!= 12 12.0)","");
  compile_fixture::run(&local_6d0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_6d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb27,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(!= 12.0 13)","");
  compile_fixture::run(&local_6f0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_6f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb28,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(!= 12.0 12)","");
  compile_fixture::run(&local_710,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_710,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb29,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(eq? \'foo \'bar) ","");
  compile_fixture::run(&local_730,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_730,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb2b,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(eq? \'foo \'foo) ","");
  compile_fixture::run(&local_750,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_750,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb2c,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(+)","");
  compile_fixture::run(&local_770,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_770,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb2e,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(*)","");
  compile_fixture::run(&local_790,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_790,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb2f,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(-)","");
  compile_fixture::run(&local_7b0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_7b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb30,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(/)","");
  compile_fixture::run(&local_7d0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_7d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb31,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(+ 3)","");
  compile_fixture::run(&local_7f0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_7f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb32,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(- 3)","");
  compile_fixture::run(&local_810,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_810,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb33,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(* 5)","");
  compile_fixture::run(&local_830,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("5",&local_830,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb34,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830._M_dataplus._M_p != &local_830.field_2) {
    operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(/ 1 5)","");
  compile_fixture::run(&local_850,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("0.2",&local_850,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb35,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850._M_dataplus._M_p != &local_850.field_2) {
    operator_delete(local_850._M_dataplus._M_p,local_850.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(/ 1 5 2)","");
  compile_fixture::run(&local_870,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("0.1",&local_870,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb36,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870._M_dataplus._M_p != &local_870.field_2) {
    operator_delete(local_870._M_dataplus._M_p,local_870.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(/ 5)","");
  compile_fixture::run(&local_890,&this->super_compile_fixture,&local_8d0,true,iVar2);
  iVar2 = 0x1faeba;
  TestEq<char_const*,std::__cxx11::string>
            ("0.2",&local_890,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb37,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_dataplus._M_p != &local_890.field_2) {
    operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  local_8d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"(/ 5.0)","");
  compile_fixture::run(&local_8b0,&this->super_compile_fixture,&local_8d0,true,iVar2);
  TestEq<char_const*,std::__cxx11::string>
            ("0.2",&local_8b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xb38,"void skiwi::(anonymous namespace)::primitive_of_2_args_inlined::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
    operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test()
      {
      build_string_to_symbol();
      ops.primitives_inlined = true;
      TEST_EQ("5", run("(+ 3 2)"));
      TEST_EQ("5.2", run("(+ 3.2 2)"));
      TEST_EQ("5.5", run("(+ 3.2 2.3)"));
      TEST_EQ("5.1", run("(+ 3 2.1)"));

      TEST_EQ("1", run("(- 3 2)"));
      TEST_EQ("1.2", run("(- 3.2 2)"));
      TEST_EQ("0.9", run("(- 3.2 2.3)"));
      TEST_EQ("0.9", run("(- 3 2.1)"));

      TEST_EQ("6", run("(* 3 2)"));
      TEST_EQ("6.4", run("(* 3.2 2)"));
      TEST_EQ("6.9", run("(* 3.0 2.3)"));
      TEST_EQ("6.3", run("(* 3 2.1)"));

      TEST_EQ("4", run("(/ 8 2)"));
      TEST_EQ("1.6", run("(/ 3.2 2)"));
      TEST_EQ("1.5", run("(/ 3.0 2.0)"));
      TEST_EQ("1.5", run("(/ 3 2.0)"));

      TEST_EQ("#f", run("(< 3 2.1)"));
      TEST_EQ("#t", run("(< 3.1 8)"));
      TEST_EQ("#f", run("(< 3.2 2.1)"));
      TEST_EQ("#t", run("(< 1 21)"));

      TEST_EQ("#f", run("(<= 3 2.1)"));
      TEST_EQ("#t", run("(<= 3.1 8)"));
      TEST_EQ("#f", run("(<= 3.2 2.1)"));
      TEST_EQ("#t", run("(<= 1 21)"));
      TEST_EQ("#t", run("(<= 2 2.0)"));
      TEST_EQ("#t", run("(<= 3.0 3)"));
      TEST_EQ("#t", run("(<= 3.2 3.2)"));
      TEST_EQ("#t", run("(<= 1 1)"));

      TEST_EQ("#t", run("(> 3 2.1)"));
      TEST_EQ("#f", run("(> 3.1 8)"));
      TEST_EQ("#t", run("(> 3.2 2.1)"));
      TEST_EQ("#f", run("(> 1 21)"));

      TEST_EQ("#t", run("(>= 3 2.1)"));
      TEST_EQ("#f", run("(>= 3.1 8)"));
      TEST_EQ("#t", run("(>= 3.2 2.1)"));
      TEST_EQ("#f", run("(>= 1 21)"));
      TEST_EQ("#t", run("(>= 2 2.0)"));
      TEST_EQ("#t", run("(>= 3.0 3)"));
      TEST_EQ("#t", run("(>= 3.2 3.2)"));
      TEST_EQ("#t", run("(>= 1 1)"));

      TEST_EQ("#f", run("(= 12 13)"));
      TEST_EQ("#t", run("(= 12 12)"));
      TEST_EQ("#f", run("(= 12.1 13.1)"));
      TEST_EQ("#t", run("(= 12.1 12.1)"));
      TEST_EQ("#f", run("(= 12 13.1)"));
      TEST_EQ("#t", run("(= 12 12.0)"));
      TEST_EQ("#f", run("(= 12.0 13)"));
      TEST_EQ("#t", run("(= 12.0 12)"));

      TEST_EQ("#t", run("(!= 12 13)"));
      TEST_EQ("#f", run("(!= 12 12)"));
      TEST_EQ("#t", run("(!= 12.1 13.1)"));
      TEST_EQ("#f", run("(!= 12.1 12.1)"));
      TEST_EQ("#t", run("(!= 12 13.1)"));
      TEST_EQ("#f", run("(!= 12 12.0)"));
      TEST_EQ("#t", run("(!= 12.0 13)"));
      TEST_EQ("#f", run("(!= 12.0 12)"));

      TEST_EQ("#f", run("(eq? 'foo 'bar) "));
      TEST_EQ("#t", run("(eq? 'foo 'foo) "));

      TEST_EQ("0", run("(+)"));
      TEST_EQ("1", run("(*)"));
      TEST_EQ("0", run("(-)"));
      TEST_EQ("1", run("(/)"));
      TEST_EQ("3", run("(+ 3)"));
      TEST_EQ("-3", run("(- 3)"));
      TEST_EQ("5", run("(* 5)"));
      TEST_EQ("0.2", run("(/ 1 5)"));
      TEST_EQ("0.1", run("(/ 1 5 2)"));
      TEST_EQ("0.2", run("(/ 5)"));
      TEST_EQ("0.2", run("(/ 5.0)"));
      }